

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvmapImage.cpp
# Opt level: O0

void __thiscall EnvmapImage::EnvmapImage(EnvmapImage *this,Envmap type,Box2i *dataWindow)

{
  int in_ESI;
  Box<Imath_3_2::Vec2<int>_> *in_RDI;
  long in_stack_00000010;
  long in_stack_00000018;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffffc8;
  EnvmapImage *in_stack_ffffffffffffffe0;
  
  (in_RDI->min).x = in_ESI;
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(in_RDI,in_stack_ffffffffffffffc8);
  Imf_3_4::Array2D<Imf_3_4::Rgba>::Array2D
            ((Array2D<Imf_3_4::Rgba> *)dataWindow,in_stack_00000018,in_stack_00000010);
  clear(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

EnvmapImage::EnvmapImage (Envmap type, const Box2i& dataWindow)
    : _type (type)
    , _dataWindow (dataWindow)
    , _pixels (
          dataWindow.max.y - dataWindow.min.y + 1,
          dataWindow.max.x - dataWindow.min.x + 1)
{
    clear ();
}